

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ai_way.cxx
# Opt level: O2

void __thiscall
xray_re::mp_rpoint_io::operator()(mp_rpoint_io *this,mp_rpoint **_rpoint,xr_reader *r)

{
  uint8_t *puVar1;
  mp_rpoint *v;
  
  v = (mp_rpoint *)operator_new(0x1c);
  *_rpoint = v;
  xr_reader::r_fvector3(r,(fvector3 *)v);
  xr_reader::r_fvector3(r,&v->a);
  puVar1 = (r->field_2).m_p;
  (r->field_2).m_p = puVar1 + 1;
  v->team = *puVar1;
  (r->field_2).m_p = puVar1 + 2;
  v->respawn = puVar1[1];
  (r->field_2).m_p = puVar1 + 3;
  v->game = puVar1[2];
  xr_reader::advance(r,1);
  return;
}

Assistant:

void mp_rpoint_io::operator()(mp_rpoint*& _rpoint, xr_reader& r) const
{
	mp_rpoint* rpoint = new mp_rpoint;
	_rpoint = rpoint;
	r.r_fvector3(rpoint->p);
	r.r_fvector3(rpoint->a);
	rpoint->team = r.r_u8();
	rpoint->respawn = r.r_u8();
	rpoint->game = r.r_u8();
	r.advance(sizeof(uint8_t));
}